

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_update_consumed_size
              (nghttp2_session *session,int32_t *consumed_size_ptr,int32_t *recv_window_size_ptr,
              uint8_t window_update_queued,int32_t stream_id,size_t delta_size,
              int32_t local_window_size)

{
  int32_t recv_window_size;
  int iVar1;
  char in_CL;
  int32_t *in_RDX;
  nghttp2_session *in_RSI;
  nghttp2_session *in_R9;
  int rv;
  int32_t recv_size;
  uint32_t in_stack_ffffffffffffffcc;
  undefined3 in_stack_ffffffffffffffdc;
  int32_t window_size_increment;
  int local_4;
  
  window_size_increment = CONCAT13(in_CL,in_stack_ffffffffffffffdc);
  if (0x7fffffffU - (long)in_R9 < (ulong)(long)*(int *)&(in_RSI->streams).table) {
    local_4 = nghttp2_session_terminate_session(in_R9,in_stack_ffffffffffffffcc);
  }
  else {
    *(int *)&(in_RSI->streams).table = (int)in_R9 + *(int *)&(in_RSI->streams).table;
    if (in_CL == '\0') {
      recv_window_size = nghttp2_min_int32(*(int32_t *)&(in_RSI->streams).table,*in_RDX);
      iVar1 = nghttp2_should_send_window_update((int32_t)delta_size,recv_window_size);
      if (iVar1 != 0) {
        iVar1 = nghttp2_session_add_window_update
                          (in_RSI,(uint8_t)((ulong)in_RDX >> 0x38),(int32_t)in_RDX,
                           window_size_increment);
        if (iVar1 != 0) {
          return iVar1;
        }
        *in_RDX = *in_RDX - recv_window_size;
        *(int *)&(in_RSI->streams).table = *(int *)&(in_RSI->streams).table - recv_window_size;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int session_update_consumed_size(nghttp2_session *session,
                                        int32_t *consumed_size_ptr,
                                        int32_t *recv_window_size_ptr,
                                        uint8_t window_update_queued,
                                        int32_t stream_id, size_t delta_size,
                                        int32_t local_window_size) {
  int32_t recv_size;
  int rv;

  if ((size_t)*consumed_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta_size) {
    return nghttp2_session_terminate_session(session,
                                             NGHTTP2_FLOW_CONTROL_ERROR);
  }

  *consumed_size_ptr += (int32_t)delta_size;

  if (window_update_queued == 0) {
    /* recv_window_size may be smaller than consumed_size, because it
       may be decreased by negative value with
       nghttp2_submit_window_update(). */
    recv_size = nghttp2_min_int32(*consumed_size_ptr, *recv_window_size_ptr);

    if (nghttp2_should_send_window_update(local_window_size, recv_size)) {
      rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE,
                                             stream_id, recv_size);

      if (rv != 0) {
        return rv;
      }

      *recv_window_size_ptr -= recv_size;
      *consumed_size_ptr -= recv_size;
    }
  }

  return 0;
}